

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

CNode * __thiscall CConnman::FindNode(CConnman *this,string *addrName)

{
  pointer ppCVar1;
  pointer __s2;
  size_t sVar2;
  size_t __n;
  int iVar3;
  CNode *pCVar4;
  pointer ppCVar5;
  long in_FS_OFFSET;
  bool bVar6;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock24;
  unique_lock<std::recursive_mutex> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48._M_device = &(this->m_nodes_mutex).super_recursive_mutex;
  local_48._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_48);
  ppCVar5 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppCVar1 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar5 != ppCVar1) {
    __s2 = (addrName->_M_dataplus)._M_p;
    sVar2 = addrName->_M_string_length;
    do {
      pCVar4 = *ppCVar5;
      __n = (pCVar4->m_addr_name)._M_string_length;
      if (__n == sVar2) {
        if (__n == 0) {
          bVar6 = true;
        }
        else {
          iVar3 = bcmp((pCVar4->m_addr_name)._M_dataplus._M_p,__s2,__n);
          bVar6 = iVar3 == 0;
        }
      }
      else {
        bVar6 = false;
      }
      if (bVar6) goto LAB_0019e457;
      ppCVar5 = ppCVar5 + 1;
    } while (ppCVar5 != ppCVar1);
  }
  pCVar4 = (CNode *)0x0;
LAB_0019e457:
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return pCVar4;
  }
  __stack_chk_fail();
}

Assistant:

CNode* CConnman::FindNode(const std::string& addrName)
{
    LOCK(m_nodes_mutex);
    for (CNode* pnode : m_nodes) {
        if (pnode->m_addr_name == addrName) {
            return pnode;
        }
    }
    return nullptr;
}